

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockIndex.h
# Opt level: O0

void __thiscall
adios2::query::BlockIndex<float>::RunStatBlocksInfo
          (BlockIndex<float> *this,QueryVar *query,size_t currStep,
          vector<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_> *hitBlocks)

{
  bool bVar1;
  undefined1 uVar2;
  reference pBVar3;
  size_type sVar4;
  Engine *pEVar5;
  reference pvVar6;
  BlockDivisionInfo *in_RCX;
  long in_RSI;
  Dims *in_RDI;
  Box<adios2::Dims> box;
  size_t d;
  Box<adios2::Dims> currSubBlock;
  bool isSubblockHit;
  uint i;
  uint numSubBlocks;
  bool allCovered;
  BlockHit tmp;
  bool isHit;
  BPInfo *blockInfo;
  iterator __end0;
  iterator __begin0;
  vector<adios2::core::Variable<float>::BPInfo,_std::allocator<adios2::core::Variable<float>::BPInfo>_>
  *__range3;
  vector<adios2::core::Variable<float>::BPInfo,_std::allocator<adios2::core::Variable<float>::BPInfo>_>
  varBlocksInfo;
  BlockDivisionInfo *in_stack_fffffffffffffe68;
  Variable<float> *in_stack_fffffffffffffe70;
  Engine *in_stack_fffffffffffffe78;
  Box<Dims> *in_stack_fffffffffffffe80;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffe88;
  undefined7 in_stack_fffffffffffffe90;
  undefined1 in_stack_fffffffffffffe97;
  BlockDivisionInfo *in_stack_fffffffffffffe98;
  undefined7 in_stack_fffffffffffffea0;
  Dims *in_stack_fffffffffffffeb0;
  QueryVar *in_stack_fffffffffffffeb8;
  float *in_stack_fffffffffffffee8;
  float *in_stack_fffffffffffffef0;
  RangeTree *in_stack_fffffffffffffef8;
  Engine *local_f8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_f0 [2];
  undefined1 local_bd;
  uint local_bc;
  uint local_b8;
  byte local_b1;
  uint in_stack_ffffffffffffff7c;
  BlockDivisionInfo *in_stack_ffffffffffffff80;
  Dims *in_stack_ffffffffffffff88;
  __normal_iterator<adios2::core::Variable<float>::BPInfo_*,_std::vector<adios2::core::Variable<float>::BPInfo,_std::allocator<adios2::core::Variable<float>::BPInfo>_>_>
  local_48;
  undefined1 *local_40;
  undefined1 local_38 [24];
  BlockDivisionInfo *local_20;
  long local_10;
  
  local_20 = in_RCX;
  local_10 = in_RSI;
  core::Engine::BlocksInfo<float>
            (in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,(size_t)in_stack_fffffffffffffe68);
  local_40 = local_38;
  local_48._M_current =
       (BPInfo *)
       std::
       vector<adios2::core::Variable<float>::BPInfo,_std::allocator<adios2::core::Variable<float>::BPInfo>_>
       ::begin((vector<adios2::core::Variable<float>::BPInfo,_std::allocator<adios2::core::Variable<float>::BPInfo>_>
                *)in_stack_fffffffffffffe68);
  std::
  vector<adios2::core::Variable<float>::BPInfo,_std::allocator<adios2::core::Variable<float>::BPInfo>_>
  ::end((vector<adios2::core::Variable<float>::BPInfo,_std::allocator<adios2::core::Variable<float>::BPInfo>_>
         *)in_stack_fffffffffffffe68);
  do {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<adios2::core::Variable<float>::BPInfo_*,_std::vector<adios2::core::Variable<float>::BPInfo,_std::allocator<adios2::core::Variable<float>::BPInfo>_>_>
                        *)in_stack_fffffffffffffe70,
                       (__normal_iterator<adios2::core::Variable<float>::BPInfo_*,_std::vector<adios2::core::Variable<float>::BPInfo,_std::allocator<adios2::core::Variable<float>::BPInfo>_>_>
                        *)in_stack_fffffffffffffe68);
    if (!bVar1) {
      std::
      vector<adios2::core::Variable<float>::BPInfo,_std::allocator<adios2::core::Variable<float>::BPInfo>_>
      ::~vector((vector<adios2::core::Variable<float>::BPInfo,_std::allocator<adios2::core::Variable<float>::BPInfo>_>
                 *)in_stack_fffffffffffffe80);
      return;
    }
    pBVar3 = __gnu_cxx::
             __normal_iterator<adios2::core::Variable<float>::BPInfo_*,_std::vector<adios2::core::Variable<float>::BPInfo,_std::allocator<adios2::core::Variable<float>::BPInfo>_>_>
             ::operator*(&local_48);
    uVar2 = RangeTree::CheckInterval<float>
                      (in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,in_stack_fffffffffffffee8
                      );
    if ((bool)uVar2) {
      if ((int)(in_RDI->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_start[8] == 5) {
        if ((bool)uVar2) {
          in_stack_fffffffffffffe98 = local_20;
          BlockHit::BlockHit((BlockHit *)in_stack_fffffffffffffe70,(size_t)in_stack_fffffffffffffe68
                            );
          std::vector<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_>::push_back
                    ((vector<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_> *)
                     in_stack_fffffffffffffe70,(value_type *)in_stack_fffffffffffffe68);
          BlockHit::~BlockHit((BlockHit *)0xd3aaba);
        }
      }
      else {
        bVar1 = QueryVar::TouchSelection(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,in_RDI)
        ;
        if (bVar1) {
          BlockHit::BlockHit((BlockHit *)in_stack_fffffffffffffe70,(size_t)in_stack_fffffffffffffe68
                            );
          sVar4 = std::vector<float,_std::allocator<float>_>::size(&pBVar3->MinMaxs);
          if (sVar4 == 0) {
LAB_00d3ae02:
            std::
            pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
            ::
            pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&,_true>
                      ((pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        *)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90),
                       in_stack_fffffffffffffe88,&in_stack_fffffffffffffe80->first);
            in_stack_fffffffffffffe68 = local_20;
            BlockHit::BlockHit((BlockHit *)
                               CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90),
                               (size_t)in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
            std::vector<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_>::
            push_back((vector<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_> *)
                      in_stack_fffffffffffffe70,(value_type *)in_stack_fffffffffffffe68);
            BlockHit::~BlockHit((BlockHit *)0xd3ae67);
            std::
            pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
            ::~pair((pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                     *)in_stack_fffffffffffffe70);
          }
          else {
            local_b1 = 1;
            helper::CalculateSubblockInfo
                      ((Dims *)CONCAT17(uVar2,in_stack_fffffffffffffea0),in_stack_fffffffffffffe98);
            sVar4 = std::vector<float,_std::allocator<float>_>::size(&pBVar3->MinMaxs);
            local_b8 = (uint)(sVar4 >> 1);
            for (local_bc = 0; local_bc < local_b8; local_bc = local_bc + 1) {
              in_stack_fffffffffffffe80 = (Box<Dims> *)(local_10 + 0x38);
              in_stack_fffffffffffffe88 =
                   (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   std::vector<float,_std::allocator<float>_>::operator[]
                             (&pBVar3->MinMaxs,(ulong)(local_bc * 2));
              std::vector<float,_std::allocator<float>_>::operator[]
                        (&pBVar3->MinMaxs,(ulong)(local_bc * 2 + 1));
              in_stack_fffffffffffffe97 =
                   RangeTree::CheckInterval<float>
                             (in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
                              in_stack_fffffffffffffee8);
              local_bd = in_stack_fffffffffffffe97;
              if ((bool)in_stack_fffffffffffffe97) {
                helper::GetSubBlock(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                                    in_stack_ffffffffffffff7c);
                local_f8 = (Engine *)0x0;
                while (in_stack_fffffffffffffe78 = local_f8,
                      pEVar5 = (Engine *)
                               std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                                         (&pBVar3->Count), in_stack_fffffffffffffe78 < pEVar5) {
                  pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                     (&pBVar3->Start,(size_type)local_f8);
                  in_stack_fffffffffffffe70 = (Variable<float> *)*pvVar6;
                  pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                     (local_f0,(size_type)local_f8);
                  *pvVar6 = (long)&(in_stack_fffffffffffffe70->super_VariableBase).
                                   _vptr_VariableBase + *pvVar6;
                  local_f8 = (Engine *)((long)&local_f8->_vptr_Engine + 1);
                }
                bVar1 = QueryVar::TouchSelection
                                  (in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,in_RDI);
                if (bVar1) {
                  std::
                  vector<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                  ::push_back((vector<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                               *)in_stack_fffffffffffffe80,(value_type *)in_stack_fffffffffffffe78);
                }
                std::
                pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                ::~pair((pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                         *)in_stack_fffffffffffffe70);
              }
              else {
                local_b1 = 0;
              }
            }
            if ((local_b1 & 1) != 0) goto LAB_00d3ae02;
            std::vector<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_>::
            push_back((vector<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_> *)
                      in_stack_fffffffffffffe80,(value_type *)in_stack_fffffffffffffe78);
          }
          BlockHit::~BlockHit((BlockHit *)0xd3ae89);
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<adios2::core::Variable<float>::BPInfo_*,_std::vector<adios2::core::Variable<float>::BPInfo,_std::allocator<adios2::core::Variable<float>::BPInfo>_>_>
    ::operator++(&local_48);
  } while( true );
}

Assistant:

void RunStatBlocksInfo(const QueryVar &query, const size_t currStep,
                           std::vector<BlockHit> &hitBlocks)
    {
        std::vector<typename adios2::core::Variable<T>::BPInfo> varBlocksInfo =
            m_IdxReader.BlocksInfo(*m_VarPtr, currStep);

        for (auto &blockInfo : varBlocksInfo)
        {
            bool isHit = query.m_RangeTree.CheckInterval(blockInfo.Min, blockInfo.Max);
            if (!isHit)
                continue;

            if (m_VarPtr->m_ShapeID == adios2::ShapeID::LocalArray)
            {
                if (isHit)
                    hitBlocks.push_back(BlockHit(blockInfo.BlockID));
            }
            else
            {
                // global array
                if (!query.TouchSelection(blockInfo.Start, blockInfo.Count))
                    continue;

                BlockHit tmp(blockInfo.BlockID);
                if (blockInfo.MinMaxs.size() > 0)
                {
                    // Consolidate to whole block If all subblocks are hits, then return the whole
                    // block
                    bool allCovered = true;

                    adios2::helper::CalculateSubblockInfo(blockInfo.Count, blockInfo.SubBlockInfo);
                    unsigned int numSubBlocks =
                        static_cast<unsigned int>(blockInfo.MinMaxs.size() / 2);
                    for (unsigned int i = 0; i < numSubBlocks; i++)
                    {
                        bool isSubblockHit = query.m_RangeTree.CheckInterval(
                            blockInfo.MinMaxs[2 * i], blockInfo.MinMaxs[2 * i + 1]);
                        if (isSubblockHit)
                        {
                            adios2::Box<adios2::Dims> currSubBlock = adios2::helper::GetSubBlock(
                                blockInfo.Count, blockInfo.SubBlockInfo, i);
                            for (size_t d = 0; d < blockInfo.Count.size(); ++d)
                                currSubBlock.first[d] += blockInfo.Start[d];

                            if (!query.TouchSelection(currSubBlock.first, currSubBlock.second))
                                continue;
                            tmp.m_Regions.push_back(currSubBlock);
                        }
                        else
                        {
                            allCovered = false;
                        }
                    } // for num subblocks

                    if (!allCovered)
                    {
                        hitBlocks.push_back(tmp);
                        continue;
                    }
                }

                // no subblock info or (allCovered = true)
                adios2::Box<adios2::Dims> box = {blockInfo.Start, blockInfo.Count};
                hitBlocks.push_back(BlockHit(blockInfo.BlockID, box));
            }
        }
    }